

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_analyze_anchor(yaml_emitter_t *emitter,yaml_char_t *anchor,int alias)

{
  int iVar1;
  size_t sVar2;
  yaml_char_t *pyVar3;
  char *pcVar4;
  int local_54;
  int local_50;
  int local_4c;
  yaml_string_t string;
  size_t anchor_length;
  int alias_local;
  yaml_char_t *anchor_local;
  yaml_emitter_t *emitter_local;
  
  sVar2 = strlen((char *)anchor);
  pyVar3 = anchor + sVar2;
  string.end = anchor;
  if (anchor == pyVar3) {
    pcVar4 = "anchor value must not be empty";
    if (alias != 0) {
      pcVar4 = "alias value must not be empty";
    }
    emitter_local._4_4_ = yaml_emitter_set_emitter_error(emitter,pcVar4);
  }
  else {
    for (; string.end != pyVar3; string.end = string.end + local_4c) {
      if (((((*string.end < 0x30) || (0x39 < *string.end)) &&
           ((*string.end < 0x41 || (0x5a < *string.end)))) &&
          (((*string.end < 0x61 || (0x7a < *string.end)) && (*string.end != '_')))) &&
         (*string.end != '-')) {
        pcVar4 = "anchor value must contain alphanumerical characters only";
        if (alias != 0) {
          pcVar4 = "alias value must contain alphanumerical characters only";
        }
        iVar1 = yaml_emitter_set_emitter_error(emitter,pcVar4);
        return iVar1;
      }
      if ((*string.end & 0x80) == 0) {
        local_4c = 1;
      }
      else {
        if ((*string.end & 0xe0) == 0xc0) {
          local_50 = 2;
        }
        else {
          if ((*string.end & 0xf0) == 0xe0) {
            local_54 = 3;
          }
          else {
            local_54 = 0;
            if ((*string.end & 0xf8) == 0xf0) {
              local_54 = 4;
            }
          }
          local_50 = local_54;
        }
        local_4c = local_50;
      }
    }
    (emitter->anchor_data).anchor = anchor;
    (emitter->anchor_data).anchor_length = (long)pyVar3 - (long)anchor;
    (emitter->anchor_data).alias = alias;
    emitter_local._4_4_ = 1;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_analyze_anchor(yaml_emitter_t *emitter,
        yaml_char_t *anchor, int alias)
{
    size_t anchor_length;
    yaml_string_t string;

    anchor_length = strlen((char *)anchor);
    STRING_ASSIGN(string, anchor, anchor_length);

    if (string.start == string.end) {
        return yaml_emitter_set_emitter_error(emitter, alias ?
                "alias value must not be empty" :
                "anchor value must not be empty");
    }

    while (string.pointer != string.end) {
        if (!IS_ALPHA(string)) {
            return yaml_emitter_set_emitter_error(emitter, alias ?
                    "alias value must contain alphanumerical characters only" :
                    "anchor value must contain alphanumerical characters only");
        }
        MOVE(string);
    }

    emitter->anchor_data.anchor = string.start;
    emitter->anchor_data.anchor_length = string.end - string.start;
    emitter->anchor_data.alias = alias;

    return 1;
}